

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O1

void __thiscall
icu_63::UTF8CollationIterator::forwardNumCodePoints
          (UTF8CollationIterator *this,int32_t num,UErrorCode *param_2)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint8_t *puVar4;
  int iVar5;
  int32_t __N;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int32_t iVar9;
  
  if (0 < num) {
    iVar3 = this->length;
    puVar4 = this->u8;
    iVar9 = this->pos;
    iVar6 = num + 1;
    do {
      lVar7 = (long)iVar9;
      if (iVar3 <= iVar9) {
        if (-1 < iVar3) {
          return;
        }
        if (puVar4[lVar7] == '\0') {
          return;
        }
      }
      uVar8 = lVar7 + 1;
      this->pos = (int)uVar8;
      bVar1 = puVar4[lVar7];
      if ((0xcc < (byte)(bVar1 + 0xb)) && ((int)uVar8 != iVar3)) {
        bVar2 = puVar4[uVar8];
        if ((bVar1 & 0xf0) == 0xe0) {
          if (((byte)" 000000000000\x1000"[bVar1 & 0xf] >> (bVar2 >> 5) & 1) != 0) {
            uVar8 = lVar7 + 2;
            this->pos = (int)uVar8;
            if ((int)uVar8 != iVar3) {
              iVar5 = 3;
              bVar2 = puVar4[uVar8];
joined_r0x00229bd7:
              uVar8 = uVar8 & 0xffffffff;
              goto joined_r0x00229b8e;
            }
LAB_00229b7b:
            uVar8 = uVar8 & 0xffffffff;
          }
        }
        else if (bVar1 < 0xe0) {
          iVar5 = 2;
joined_r0x00229b8e:
          if ((char)bVar2 < -0x40) {
            this->pos = iVar9 + iVar5;
            uVar8 = (ulong)(uint)(iVar9 + iVar5);
          }
        }
        else if (((byte)""[bVar2 >> 4] >> (bVar1 & 7) & 1) != 0) {
          uVar8 = lVar7 + 2;
          this->pos = (int)uVar8;
          if (((int)uVar8 != iVar3) && ((char)puVar4[uVar8] < -0x40)) {
            uVar8 = lVar7 + 3;
            this->pos = (int)uVar8;
            if ((int)uVar8 != iVar3) {
              iVar5 = 4;
              bVar2 = puVar4[uVar8];
              goto joined_r0x00229bd7;
            }
            goto LAB_00229b7b;
          }
        }
      }
      iVar6 = iVar6 + -1;
      iVar9 = (int32_t)uVar8;
    } while (1 < iVar6);
  }
  return;
}

Assistant:

void
UTF8CollationIterator::forwardNumCodePoints(int32_t num, UErrorCode & /*errorCode*/) {
    U8_FWD_N(u8, pos, length, num);
}